

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian.cpp
# Opt level: O2

void __thiscall amrex::MLNodeLaplacian::checkPoint(MLNodeLaplacian *this,string *file_name)

{
  FabArray<amrex::FArrayBox> *mf;
  ostream *poVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  string HeaderFileName;
  string local_270;
  string local_250;
  ofstream HeaderFile;
  undefined8 auStack_228 [3];
  int aiStack_210 [120];
  
  if (*(int *)(DAT_007dd980 + -0x3c) == *(int *)(DAT_007dd980 + -0x30)) {
    UtilCreateCleanDirectory(file_name,false);
    std::operator+(&HeaderFileName,file_name,"/Header");
    std::ofstream::ofstream(&HeaderFile);
    std::ofstream::open((char *)&HeaderFile,(_Ios_Openmode)HeaderFileName._M_dataplus._M_p);
    lVar3 = *(long *)(_HeaderFile + -0x18);
    if (*(int *)((long)aiStack_210 + lVar3) != 0) {
      FileOpenFailed(&HeaderFileName);
      lVar3 = *(long *)(_HeaderFile + -0x18);
    }
    *(undefined8 *)((long)auStack_228 + lVar3) = 0x11;
    poVar1 = std::operator<<((ostream *)&HeaderFile,"verbose = ");
    poVar1 = (ostream *)
             std::ostream::operator<<(poVar1,(this->super_MLNodeLinOp).super_MLLinOp.verbose);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"nlevs = ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,(this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"do_agglomeration = ");
    poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"do_consolidation = ");
    poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"agg_grid_size = ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,(this->super_MLNodeLinOp).super_MLLinOp.info.agg_grid_size);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"con_grid_size = ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,(this->super_MLNodeLinOp).super_MLLinOp.info.con_grid_size);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"has_metric_term = ");
    poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"max_coarsening_level = ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,(this->super_MLNodeLinOp).super_MLLinOp.info.max_coarsening_level);
    std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<((ostream *)&HeaderFile,"lobc = ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,((this->super_MLNodeLinOp).super_MLLinOp.m_lobc.
                                super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                                .
                                super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0]);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,((this->super_MLNodeLinOp).super_MLLinOp.m_lobc.
                                super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                                .
                                super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_elems[1]);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,((this->super_MLNodeLinOp).super_MLLinOp.m_lobc.
                                super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                                .
                                super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_elems[2]);
    std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<((ostream *)&HeaderFile,"hibc = ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,((this->super_MLNodeLinOp).super_MLLinOp.m_hibc.
                                super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                                .
                                super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0]);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,((this->super_MLNodeLinOp).super_MLLinOp.m_hibc.
                                super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                                .
                                super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_elems[1]);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,((this->super_MLNodeLinOp).super_MLLinOp.m_hibc.
                                super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                                .
                                super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_elems[2]);
    std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<((ostream *)&HeaderFile,"maxorder = ");
    poVar1 = (ostream *)
             std::ostream::operator<<(poVar1,(this->super_MLNodeLinOp).super_MLLinOp.maxorder);
    std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<((ostream *)&HeaderFile,"is_rz = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_is_rz);
    std::operator<<(poVar1,"\n");
    std::operator<<((ostream *)&HeaderFile,"m_const_sigma = ");
    poVar1 = std::ostream::_M_insert<double>(this->m_const_sigma);
    std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<((ostream *)&HeaderFile,"use_gauss_seidel = ");
    poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
    std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<((ostream *)&HeaderFile,"use_harmonic_average = ");
    poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
    std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<((ostream *)&HeaderFile,"coarsen_strategy = ");
    poVar1 = (ostream *)
             std::ostream::operator<<(poVar1,(this->super_MLNodeLinOp).m_coarsening_strategy);
    std::operator<<(poVar1,"\n");
    std::ofstream::~ofstream
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&HeaderFile);
    std::__cxx11::string::~string((string *)&HeaderFileName);
    lVar4 = 0;
    for (lVar3 = 0; lVar3 < (this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels;
        lVar3 = lVar3 + 1) {
      std::operator+(&HeaderFileName,file_name,"/Level_");
      std::__cxx11::to_string(&local_270,(int)lVar3);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &HeaderFile,&HeaderFileName,&local_270);
      UtilCreateCleanDirectory
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&HeaderFile,
                 false);
      std::__cxx11::string::~string((string *)&HeaderFile);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&HeaderFileName);
      std::operator+(&local_270,file_name,"/Level_");
      std::__cxx11::to_string(&local_250,(int)lVar3);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &HeaderFile,&local_270,&local_250);
      std::operator+(&HeaderFileName,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &HeaderFile,"/Header");
      std::__cxx11::string::~string((string *)&HeaderFile);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_270);
      std::ofstream::ofstream
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&HeaderFile);
      std::ofstream::open((char *)&HeaderFile,(_Ios_Openmode)HeaderFileName._M_dataplus._M_p);
      lVar2 = *(long *)(_HeaderFile + -0x18);
      if (*(int *)((long)aiStack_210 + lVar2) != 0) {
        FileOpenFailed(&HeaderFileName);
        lVar2 = *(long *)(_HeaderFile + -0x18);
      }
      *(undefined8 *)((long)auStack_228 + lVar2) = 0x11;
      poVar1 = amrex::operator<<((ostream *)&HeaderFile,
                                 *(Geometry **)
                                  ((long)&(((this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                                            super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                            .
                                            super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                          ).
                                          super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                  + lVar4));
      std::operator<<(poVar1,"\n");
      BoxArray::writeOn(*(BoxArray **)
                         ((long)&(((this->super_MLNodeLinOp).super_MLLinOp.m_grids.
                                   super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                   .
                                   super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                                 super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                         + lVar4),(ostream *)&HeaderFile);
      std::operator<<((ostream *)&HeaderFile,"\n");
      std::ofstream::~ofstream
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&HeaderFile);
      std::__cxx11::string::~string((string *)&HeaderFileName);
      lVar4 = lVar4 + 0x18;
    }
  }
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < (this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels;
      lVar4 = lVar4 + 1) {
    mf = (FabArray<amrex::FArrayBox> *)
         **(undefined8 **)
           ((long)&(((this->m_sigma).
                     super_vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super_vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                   ).
                   super__Vector_base<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
           + lVar3);
    if (mf != (FabArray<amrex::FArrayBox> *)0x0) {
      std::operator+(&local_270,file_name,"/Level_");
      std::__cxx11::to_string(&local_250,(int)lVar4);
      std::operator+(&HeaderFileName,&local_270,&local_250);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &HeaderFile,&HeaderFileName,"/sigma");
      VisMF::Write(mf,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &HeaderFile,NFiles,false);
      std::__cxx11::string::~string((string *)&HeaderFile);
      std::__cxx11::string::~string((string *)&HeaderFileName);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_270);
    }
    lVar3 = lVar3 + 0x18;
  }
  return;
}

Assistant:

void
MLNodeLaplacian::checkPoint (std::string const& file_name) const
{
    if (ParallelContext::IOProcessorSub())
    {
        UtilCreateCleanDirectory(file_name, false);
        {
            std::string HeaderFileName(file_name+"/Header");
            std::ofstream HeaderFile;
            HeaderFile.open(HeaderFileName.c_str(), std::ofstream::out   |
                                                    std::ofstream::trunc |
                                                    std::ofstream::binary);
            if( ! HeaderFile.good()) {
                FileOpenFailed(HeaderFileName);
            }

            HeaderFile.precision(17);

            // MLLinop stuff
            HeaderFile << "verbose = " << verbose << "\n"
                       << "nlevs = " << NAMRLevels() << "\n"
                       << "do_agglomeration = " << info.do_agglomeration << "\n"
                       << "do_consolidation = " << info.do_consolidation << "\n"
                       << "agg_grid_size = " << info.agg_grid_size << "\n"
                       << "con_grid_size = " << info.con_grid_size << "\n"
                       << "has_metric_term = " << info.has_metric_term << "\n"
                       << "max_coarsening_level = " << info.max_coarsening_level << "\n";
#if (AMREX_SPACEDIM == 1)
            HeaderFile << "lobc = " << static_cast<int>(m_lobc[0][0]) << "\n";
#elif (AMREX_SPACEDIM == 2)
            HeaderFile << "lobc = " << static_cast<int>(m_lobc[0][0])
                       << " "       << static_cast<int>(m_lobc[0][1]) << "\n";
#else
            HeaderFile << "lobc = " << static_cast<int>(m_lobc[0][0])
                       << " "       << static_cast<int>(m_lobc[0][1])
                       << " "       << static_cast<int>(m_lobc[0][2]) << "\n";
#endif
#if (AMREX_SPACEDIM == 1)
            HeaderFile << "hibc = " << static_cast<int>(m_hibc[0][0]) << "\n";
#elif (AMREX_SPACEDIM == 2)
            HeaderFile << "hibc = " << static_cast<int>(m_hibc[0][0])
                       << " "       << static_cast<int>(m_hibc[0][1]) << "\n";
#else
            HeaderFile << "hibc = " << static_cast<int>(m_hibc[0][0])
                       << " "       << static_cast<int>(m_hibc[0][1])
                       << " "       << static_cast<int>(m_hibc[0][2]) << "\n";
#endif
            // m_coarse_data_for_bc: not used
            HeaderFile << "maxorder = " << getMaxOrder() << "\n";

            // MLNodeLaplacian stuff
            HeaderFile << "is_rz = " << m_is_rz << "\n";
            HeaderFile << "m_const_sigma = " << m_const_sigma << "\n";
            HeaderFile << "use_gauss_seidel = " << m_use_gauss_seidel << "\n";
            HeaderFile << "use_harmonic_average = " << m_use_harmonic_average << "\n";
            HeaderFile << "coarsen_strategy = " << static_cast<int>(m_coarsening_strategy) << "\n";
            // No level bc multifab
        }

        for (int ilev = 0; ilev < NAMRLevels(); ++ilev)
        {
            UtilCreateCleanDirectory(file_name+"/Level_"+std::to_string(ilev), false);
            std::string HeaderFileName(file_name+"/Level_"+std::to_string(ilev)+"/Header");
            std::ofstream HeaderFile;
            HeaderFile.open(HeaderFileName.c_str(), std::ofstream::out   |
                                                    std::ofstream::trunc |
                                                    std::ofstream::binary);
            if( ! HeaderFile.good()) {
                FileOpenFailed(HeaderFileName);
            }

            HeaderFile.precision(17);

            HeaderFile << Geom(ilev) << "\n";
            m_grids[ilev][0].writeOn(HeaderFile);  HeaderFile << "\n";
        }
    }

    ParallelContext::BarrierSub();

    for (int ilev = 0; ilev < NAMRLevels(); ++ilev)
    {
        if (m_sigma[ilev][0][0]) {
            VisMF::Write(*m_sigma[ilev][0][0], file_name+"/Level_"+std::to_string(ilev)+"/sigma");
        }
    }
}